

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::DistConstraintListSyntax::DistConstraintListSyntax
          (DistConstraintListSyntax *this,Token dist,Token openBrace,
          SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *items,Token closeBrace)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  DistItemBaseSyntax *pDVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax> *__range2;
  iterator_base<slang::syntax::DistItemBaseSyntax_*> local_30;
  
  uVar5 = openBrace._0_8_;
  uVar6 = dist._0_8_;
  (this->super_SyntaxNode).kind = DistConstraintList;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (this->dist).kind = (short)uVar6;
  (this->dist).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->dist).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->dist).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->dist).info = dist.info;
  (this->openBrace).kind = (short)uVar5;
  (this->openBrace).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->openBrace).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->openBrace).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->openBrace).info = openBrace.info;
  uVar3 = *(undefined4 *)&(items->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (items->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (items->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (items->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->items).super_SyntaxListBase.childCount = (items->super_SyntaxListBase).childCount;
  (this->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00599df0;
  sVar1 = (items->elements)._M_extent._M_extent_value;
  (this->items).elements._M_ptr = (items->elements)._M_ptr;
  (this->items).elements._M_extent._M_extent_value = sVar1;
  (this->closeBrace).kind = closeBrace.kind;
  (this->closeBrace).field_0x2 = closeBrace._2_1_;
  (this->closeBrace).numFlags = (NumericTokenFlags)closeBrace.numFlags.raw;
  (this->closeBrace).rawLen = closeBrace.rawLen;
  (this->closeBrace).info = closeBrace.info;
  (this->items).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  local_30.index = 0;
  sVar1 = (this->items).elements._M_extent._M_extent_value;
  local_30.list = &this->items;
  for (; (local_30.list != &this->items || (local_30.index != sVar1 + 1 >> 1));
      local_30.index = local_30.index + 1) {
    pDVar4 = SeparatedSyntaxList<slang::syntax::DistItemBaseSyntax>::
             iterator_base<slang::syntax::DistItemBaseSyntax_*>::dereference(&local_30);
    (pDVar4->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  return;
}

Assistant:

DistConstraintListSyntax(Token dist, Token openBrace, const SeparatedSyntaxList<DistItemBaseSyntax>& items, Token closeBrace) :
        SyntaxNode(SyntaxKind::DistConstraintList), dist(dist), openBrace(openBrace), items(items), closeBrace(closeBrace) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }